

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void kca_fvk(kca_joint *joint,ga_twist *xd)

{
  ga_twist *xd_local;
  kca_joint *joint_local;
  
  if (joint == (kca_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x1a,"void kca_fvk(const struct kca_joint *, struct ga_twist *)");
  }
  if (xd != (ga_twist *)0x0) {
    if (joint->target_frame != (frame *)0x0) {
      xd->target_body = joint->target_body;
      xd->reference_body = joint->reference_body;
      xd->point = joint->target_frame->origin;
      xd->frame = joint->target_frame;
      return;
    }
    __assert_fail("joint->target_frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x1c,"void kca_fvk(const struct kca_joint *, struct ga_twist *)");
  }
  __assert_fail("xd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x1b,"void kca_fvk(const struct kca_joint *, struct ga_twist *)");
}

Assistant:

void kca_fvk(
        const struct kca_joint *joint,
        struct ga_twist *xd)
{
    assert(joint);
    assert(xd);
    assert(joint->target_frame);

    xd->target_body = joint->target_body;
    xd->reference_body = joint->reference_body;
    xd->point = joint->target_frame->origin;
    xd->frame = joint->target_frame;
}